

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrbmp.c
# Opt level: O1

void put_gray_rows(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo,JDIMENSION rows_supplied)

{
  int *piVar1;
  JSAMPARRAY __dest;
  JSAMPARRAY *pppJVar2;
  
  if (*(int *)&dinfo[1].output_file == 0) {
    pppJVar2 = &dinfo[1].buffer;
  }
  else {
    pppJVar2 = (JSAMPARRAY *)
               (*cinfo->mem->access_virt_sarray)
                         ((j_common_ptr)cinfo,(jvirt_sarray_ptr)dinfo[1].put_pixel_rows,
                          *(JDIMENSION *)((long)&dinfo[1].calc_buffer_dimensions + 4),1,1);
    piVar1 = (int *)((long)&dinfo[1].calc_buffer_dimensions + 4);
    *piVar1 = *piVar1 + 1;
  }
  __dest = *pppJVar2;
  memcpy(__dest,*dinfo->buffer,(ulong)cinfo->output_width);
  if (0 < (long)*(int *)&dinfo[1].calc_buffer_dimensions) {
    memset((JSAMPROW)((long)__dest + (ulong)cinfo->output_width),0,
           (long)*(int *)&dinfo[1].calc_buffer_dimensions);
  }
  if (*(int *)&dinfo[1].output_file != 0) {
    return;
  }
  fwrite(dinfo[1].buffer,1,(ulong)*(uint *)((long)&dinfo[1].finish_output + 4),
         (FILE *)dinfo->output_file);
  return;
}

Assistant:

METHODDEF(void)
put_gray_rows(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo,
              JDIMENSION rows_supplied)
/* This version is for grayscale OR quantized color output */
{
  bmp_dest_ptr dest = (bmp_dest_ptr)dinfo;
  JSAMPARRAY image_ptr;
  register JSAMPROW inptr, outptr;
  int pad;

  if (dest->use_inversion_array) {
    /* Access next row in virtual array */
    image_ptr = (*cinfo->mem->access_virt_sarray)
      ((j_common_ptr)cinfo, dest->whole_image,
       dest->cur_output_row, (JDIMENSION)1, TRUE);
    dest->cur_output_row++;
    outptr = image_ptr[0];
  } else {
    outptr = dest->iobuffer;
  }

  /* Transfer data. */
  inptr = dest->pub.buffer[0];
  MEMCOPY(outptr, inptr, cinfo->output_width);
  outptr += cinfo->output_width;

  /* Zero out the pad bytes. */
  pad = dest->pad_bytes;
  while (--pad >= 0)
    *outptr++ = 0;

  if (!dest->use_inversion_array)
    (void)JFWRITE(dest->pub.output_file, dest->iobuffer, dest->row_width);
}